

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.h
# Opt level: O0

char * QTest::Internal::genericToString<QModelIndex>(void *arg)

{
  char *pcVar1;
  QModelIndex *in_stack_00000038;
  
  pcVar1 = toString<QModelIndex>(in_stack_00000038);
  return pcVar1;
}

Assistant:

const char *genericToString(const void *arg)
    {
        using QTest::toString;
        return toString(*static_cast<const T1 *>(arg));
    }